

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O2

int __thiscall
crnlib::texture_conversion::convert_stats::init(convert_stats *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  bool bVar5;
  uint uVar6;
  mipmapped_texture *in_RCX;
  char *in_RDX;
  int iVar7;
  char *p;
  format in_R8D;
  uint uVar8;
  char in_R9B;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  vector<unsigned_char> dst_tex_bytes;
  vector<unsigned_char> cmp_tex_bytes;
  lzma_codec lossless_codec;
  vector<unsigned_char> local_68;
  vector<unsigned_char> local_58;
  lzma_codec local_40;
  
  dynamic_string::operator=(&this->m_src_filename,(char *)ctx);
  dynamic_string::operator=(&this->m_dst_filename,in_RDX);
  this->m_dst_file_type = in_R8D;
  this->m_pInput_tex = in_RCX;
  file_utils::get_file_size((char *)ctx,&this->m_input_file_size);
  file_utils::get_file_size(in_RDX,&this->m_output_file_size);
  this->m_total_input_pixels = 0;
  uVar1 = (in_RCX->m_faces).m_size;
  pvVar4 = (in_RCX->m_faces).m_p;
  uVar2 = in_RCX->m_width;
  uVar3 = in_RCX->m_height;
  uVar8 = 0;
  uVar6 = 0;
  while( true ) {
    uVar9 = 0;
    if (uVar1 != 0) {
      uVar9 = pvVar4->m_size;
    }
    if (uVar9 <= uVar6) break;
    uVar10 = uVar2 >> ((byte)uVar6 & 0x1f);
    uVar11 = uVar3 >> ((byte)uVar6 & 0x1f);
    uVar8 = uVar8 + (uVar10 + (uVar10 == 0)) * uVar1 * (uVar11 + (uVar11 == 0));
    this->m_total_input_pixels = uVar8;
    uVar6 = uVar6 + 1;
  }
  this->m_output_comp_file_size = 0;
  this->m_total_output_pixels = 0;
  if (in_R9B == '\0') {
LAB_00137697:
    bVar5 = mipmapped_texture::read_from_file(&this->m_output_tex,in_RDX,this->m_dst_file_type);
    if (bVar5) {
      uVar1 = (this->m_output_tex).m_faces.m_size;
      uVar8 = this->m_total_output_pixels;
      pvVar4 = (this->m_output_tex).m_faces.m_p;
      uVar2 = (this->m_output_tex).m_width;
      uVar3 = (this->m_output_tex).m_height;
      uVar6 = 0;
      while( true ) {
        uVar9 = 0;
        if (uVar1 != 0) {
          uVar9 = pvVar4->m_size;
        }
        if (uVar9 <= uVar6) break;
        uVar10 = uVar2 >> ((byte)uVar6 & 0x1f);
        uVar11 = uVar3 >> ((byte)uVar6 & 0x1f);
        uVar8 = uVar8 + (uVar10 + (uVar10 == 0)) * uVar1 * (uVar11 + (uVar11 == 0));
        this->m_total_output_pixels = uVar8;
        uVar6 = uVar6 + 1;
      }
      iVar7 = (int)CONCAT71((int7)((ulong)this >> 8),1);
    }
    else {
      iVar7 = 0;
      console::error("Failed loading output file: %s");
    }
  }
  else {
    local_68.m_p = (uchar *)0x0;
    local_68.m_size = 0;
    local_68.m_capacity = 0;
    bVar5 = cfile_stream::read_file_into_array(in_RDX,&local_68);
    if (bVar5) {
      if (local_68.m_size != 0) {
        local_58.m_p = (uchar *)0x0;
        local_58.m_size = 0;
        local_58.m_capacity = 0;
        lzma_codec::lzma_codec(&local_40);
        bVar5 = lzma_codec::pack(&local_40,local_68.m_p,local_68.m_size,&local_58);
        if (bVar5) {
          this->m_output_comp_file_size = local_58._8_8_ & 0xffffffff;
        }
        lzma_codec::~lzma_codec(&local_40);
        vector<unsigned_char>::~vector(&local_58);
        vector<unsigned_char>::~vector(&local_68);
        goto LAB_00137697;
      }
      p = "Output file is empty: %s";
    }
    else {
      p = "Failed loading output file: %s";
    }
    console::error(p);
    vector<unsigned_char>::~vector(&local_68);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

bool convert_stats::init(const char* pSrc_filename, const char* pDst_filename, mipmapped_texture& src_tex,
            texture_file_types::format dst_file_type, bool lzma_stats)
        {
            m_src_filename = pSrc_filename;
            m_dst_filename = pDst_filename;
            m_dst_file_type = dst_file_type;

            m_pInput_tex = &src_tex;

            file_utils::get_file_size(pSrc_filename, m_input_file_size);
            file_utils::get_file_size(pDst_filename, m_output_file_size);

            m_total_input_pixels = 0;
            for (uint i = 0; i < src_tex.get_num_levels(); i++)
            {
                uint width = math::maximum<uint>(1, src_tex.get_width() >> i);
                uint height = math::maximum<uint>(1, src_tex.get_height() >> i);
                m_total_input_pixels += width * height * src_tex.get_num_faces();
            }

            m_output_comp_file_size = 0;

            m_total_output_pixels = 0;

            if (lzma_stats)
            {
                vector<uint8> dst_tex_bytes;
                if (!cfile_stream::read_file_into_array(pDst_filename, dst_tex_bytes))
                {
                    console::error("Failed loading output file: %s", pDst_filename);
                    return false;
                }
                if (!dst_tex_bytes.size())
                {
                    console::error("Output file is empty: %s", pDst_filename);
                    return false;
                }
                vector<uint8> cmp_tex_bytes;
                lzma_codec lossless_codec;
                if (lossless_codec.pack(dst_tex_bytes.get_ptr(), dst_tex_bytes.size(), cmp_tex_bytes))
                {
                    m_output_comp_file_size = cmp_tex_bytes.size();
                }
            }

            if (!m_output_tex.read_from_file(pDst_filename, m_dst_file_type))
            {
                console::error("Failed loading output file: %s", pDst_filename);
                return false;
            }

            for (uint i = 0; i < m_output_tex.get_num_levels(); i++)
            {
                uint width = math::maximum<uint>(1, m_output_tex.get_width() >> i);
                uint height = math::maximum<uint>(1, m_output_tex.get_height() >> i);
                m_total_output_pixels += width * height * m_output_tex.get_num_faces();
            }
            CRNLIB_ASSERT(m_total_output_pixels == m_output_tex.get_total_pixels_in_all_faces_and_mips());

            return true;
        }